

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall CP::list<int>::check_pointer(list<int> *this)

{
  ulong uVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  size_t i_1;
  node *p;
  vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> ptr;
  set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
  s;
  
  std::vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::vector
            (&ptr,this->mSize + 1,(allocator_type *)&s);
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &s._M_t._M_impl.super__Rb_tree_header._M_header;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p = this->mHeader;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar3 = 0; uVar1 = this->mSize + 1, uVar3 < uVar1; uVar3 = uVar3 + 1) {
    std::
    _Rb_tree<CP::list<int>::node*,CP::list<int>::node*,std::_Identity<CP::list<int>::node*>,std::less<CP::list<int>::node*>,std::allocator<CP::list<int>::node*>>
    ::_M_insert_unique<CP::list<int>::node*const&>
              ((_Rb_tree<CP::list<int>::node*,CP::list<int>::node*,std::_Identity<CP::list<int>::node*>,std::less<CP::list<int>::node*>,std::allocator<CP::list<int>::node*>>
                *)&s,&p);
    ptr.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = p;
    p = p->next;
  }
  if (s._M_t._M_impl.super__Rb_tree_header._M_node_count < uVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"ERROR: loop detected");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  for (uVar3 = 0; uVar1 = this->mSize, uVar3 < uVar1; uVar3 = uVar3 + 1) {
    if (ptr.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3]->next !=
        ptr.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3 + 1]) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ERROR: next pointer broken at position ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  for (uVar3 = 1; uVar3 <= uVar1; uVar3 = uVar3 + 1) {
    if (ptr.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3]->prev !=
        ptr.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3 - 1]) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ERROR: prev pointer broken at position ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      uVar1 = this->mSize;
    }
  }
  std::
  _Rb_tree<CP::list<int>::node_*,_CP::list<int>::node_*,_std::_Identity<CP::list<int>::node_*>,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
  ::~_Rb_tree(&s._M_t);
  std::_Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::~_Vector_base
            (&ptr.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>)
  ;
  return;
}

Assistant:

void check_pointer() {
      std::vector<node*> ptr(mSize+1);
      std::set<node*> s;
      node* p = mHeader;
      for (size_t i = 0;i < mSize+1;i++) {
        s.insert(p);
        ptr[i] = p;
        p = p->next;
      }

      if (s.size() < mSize+1) {
        std::cout << "ERROR: loop detected" << std::endl;
      }

      //check forward
      for (size_t i = 0;i < mSize;i++) {
        if (ptr[i]->next != ptr[i+1]) {
          std::cout << "ERROR: next pointer broken at position " << i << std::endl;
        }
      }

      //check backward
      for (size_t i = 1;i <= mSize;i++) {
        if (ptr[i]->prev != ptr[i-1]) {
          std::cout << "ERROR: prev pointer broken at position " << i << std::endl;
        }
      }
    }